

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O2

Response * __thiscall
prometheus::anon_unknown_0::IntegrationTest::FetchMetrics
          (Response *__return_storage_ptr__,IntegrationTest *this,string *metrics_path)

{
  int iVar1;
  void *__p;
  runtime_error *prVar2;
  shared_ptr<void> curl;
  char *ct;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> url;
  
  __p = (void *)curl_easy_init();
  std::__shared_ptr<void,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<void,void(*)(void*),void>
            ((__shared_ptr<void,(__gnu_cxx::_Lock_policy)2> *)&curl,__p,curl_easy_cleanup);
  if (curl.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"failed to initialize libcurl");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::operator+(&url,&this->base_url_,metrics_path);
  __return_storage_ptr__->code = 0;
  (__return_storage_ptr__->body)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->body).field_2
  ;
  (__return_storage_ptr__->body)._M_string_length = 0;
  (__return_storage_ptr__->body).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->contentType)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->contentType).field_2;
  (__return_storage_ptr__->contentType)._M_string_length = 0;
  (__return_storage_ptr__->contentType).field_2._M_local_buf[0] = '\0';
  curl_easy_setopt(curl.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0x2712,
                   url._M_dataplus._M_p);
  curl_easy_setopt(curl.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0x2711,
                   &__return_storage_ptr__->body);
  curl_easy_setopt(curl.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0x4e2b,
                   WriteCallback);
  if ((this->fetchPrePerform_).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_(void_*)>::operator()
              (&this->fetchPrePerform_,
               curl.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  iVar1 = curl_easy_perform(curl.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (iVar1 != 0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"failed to perform HTTP request");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  curl_easy_getinfo(curl.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0x200002,
                    __return_storage_ptr__);
  curl_easy_getinfo(curl.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0x100012);
  std::__cxx11::string::~string((string *)&url);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&curl.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

Response FetchMetrics(const std::string& metrics_path) const {
    auto curl = std::shared_ptr<CURL>(curl_easy_init(), curl_easy_cleanup);
    if (!curl) {
      throw std::runtime_error("failed to initialize libcurl");
    }

    const auto url = base_url_ + metrics_path;
    Response response;

    curl_easy_setopt(curl.get(), CURLOPT_URL, url.c_str());
    curl_easy_setopt(curl.get(), CURLOPT_WRITEDATA, &response.body);
    curl_easy_setopt(curl.get(), CURLOPT_WRITEFUNCTION, WriteCallback);

    if (fetchPrePerform_) {
      fetchPrePerform_(curl.get());
    }

    CURLcode curl_error = curl_easy_perform(curl.get());
    if (curl_error != CURLE_OK) {
      throw std::runtime_error("failed to perform HTTP request");
    }

    curl_easy_getinfo(curl.get(), CURLINFO_RESPONSE_CODE, &response.code);

    char* ct = nullptr;
    curl_easy_getinfo(curl.get(), CURLINFO_CONTENT_TYPE, &ct);
    if (ct) {
      response.contentType = ct;
    }

    return response;
  }